

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void icetRenderTransferFullImages
               (IceTImage image,IceTVoid *inSparseImageBuffer,IceTSparseImage outSparseImage,
               IceTInt *tile_image_dest)

{
  IceTInt *incomingBuffer;
  IceTBoolean messagesInOrder;
  IceTSizeType bufferSize;
  IceTInt *messageDestinations;
  int local_54;
  IceTInt i;
  IceTInt *imageDestinations;
  IceTSizeType local_40;
  IceTInt height;
  IceTInt width;
  IceTInt num_tiles;
  IceTInt *tile_list;
  IceTInt *pIStack_28;
  IceTInt num_sending;
  IceTInt *tile_image_dest_local;
  IceTVoid *inSparseImageBuffer_local;
  IceTSparseImage outSparseImage_local;
  IceTImage image_local;
  
  rtfi_first = '\x01';
  rtfi_image = image;
  rtfi_outSparseImage = outSparseImage;
  pIStack_28 = tile_image_dest;
  tile_image_dest_local = (IceTInt *)inSparseImageBuffer;
  inSparseImageBuffer_local = outSparseImage.opaque_internals;
  outSparseImage_local.opaque_internals = image.opaque_internals;
  icetGetIntegerv(0x86,(IceTInt *)((long)&tile_list + 4));
  _width = icetUnsafeStateGetInteger(0x87);
  icetGetIntegerv(0x13,&local_40);
  icetGetIntegerv(0x14,(IceTInt *)((long)&imageDestinations + 4));
  icetGetIntegerv(0x10,&height);
  messageDestinations = (IceTInt *)malloc((long)height << 2);
  for (local_54 = 0; local_54 < tile_list._4_4_; local_54 = local_54 + 1) {
    messageDestinations[local_54] = pIStack_28[_width[local_54]];
  }
  messagesInOrder = icetIsEnabled(0x142);
  incomingBuffer = tile_image_dest_local;
  bufferSize = icetSparseImageBufferSize(local_40,imageDestinations._4_4_);
  icetSendRecvLargeMessages
            (tile_list._4_4_,messageDestinations,messagesInOrder,rtfi_generateDataFunc,
             rtfi_handleDataFunc,incomingBuffer,bufferSize);
  free(messageDestinations);
  return;
}

Assistant:

void icetRenderTransferFullImages(IceTImage image,
                                  IceTVoid *inSparseImageBuffer,
                                  IceTSparseImage outSparseImage,
                                  IceTInt *tile_image_dest)
{
    IceTInt num_sending;
    const IceTInt *tile_list;
    IceTInt num_tiles;
    IceTInt width, height;
    IceTInt *imageDestinations;

    IceTInt i;

    rtfi_image = image;
    rtfi_outSparseImage = outSparseImage;
    rtfi_first = ICET_TRUE;

    icetGetIntegerv(ICET_NUM_CONTAINED_TILES, &num_sending);
    tile_list = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &height);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);

    imageDestinations = malloc(num_tiles * sizeof(IceTInt));

  /* Make each element imageDestinations point to the processor to send the
     corresponding image in tile_list. */
    for (i = 0; i < num_sending; i++) {
        imageDestinations[i] = tile_image_dest[tile_list[i]];
    }

    icetSendRecvLargeMessages(num_sending, imageDestinations,
                              icetIsEnabled(ICET_ORDERED_COMPOSITE),
                              rtfi_generateDataFunc, rtfi_handleDataFunc,
                              inSparseImageBuffer,
                              icetSparseImageBufferSize(width, height));

    free(imageDestinations);
}